

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

void __thiscall
re2::Prog::MarkDominator
          (Prog *this,int root,SparseArray<int> *rootmap,SparseArray<int> *predmap,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *predvec,SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  int i;
  pointer piVar1;
  iterator iVar2;
  Inst *pIVar3;
  pointer pvVar4;
  int *piVar5;
  bool bVar6;
  int *piVar7;
  uint uVar8;
  uint i_00;
  int *piVar9;
  uint local_4c;
  int local_48;
  anon_union_4_5_a3ff96c3_for_Inst_2 local_44;
  SparseArray<int> *local_40;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_38;
  
  reachable->size_ = 0;
  piVar1 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
      != piVar1) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1;
  }
  iVar2._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  local_4c = root;
  local_40 = predmap;
  local_38 = predvec;
  if (iVar2._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar2,(int *)&local_4c);
  }
  else {
    *iVar2._M_current = root;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         iVar2._M_current + 1;
  }
  do {
    piVar1 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start == piVar1) {
      if (reachable->size_ != 0) {
        piVar9 = (reachable->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                 super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        do {
          i = *piVar9;
          bVar6 = SparseArray<int>::has_index(local_40,i);
          if (bVar6) {
            piVar7 = SparseArray<int>::get_existing(local_40,i);
            pvVar4 = (local_38->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            piVar5 = *(pointer *)
                      ((long)&pvVar4[*piVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data + 8);
            for (piVar7 = pvVar4[*piVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start; piVar7 != piVar5; piVar7 = piVar7 + 1) {
              bVar6 = SparseSetT<void>::contains(reachable,*piVar7);
              if ((!bVar6) && (bVar6 = SparseArray<int>::has_index(rootmap,i), !bVar6)) {
                local_48 = rootmap->size_;
                SparseArray<int>::SetInternal(rootmap,false,i,&local_48);
              }
            }
          }
          piVar9 = piVar9 + 1;
        } while (piVar9 != (reachable->dense_).ptr_._M_t.
                           super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                           super__Head_base<0UL,_int_*,_false>._M_head_impl + reachable->size_);
      }
      return;
    }
    i_00 = piVar1[-1];
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar1 + -1;
    do {
      bVar6 = SparseSetT<void>::contains(reachable,i_00);
      if ((bVar6) ||
         ((SparseSetT<void>::InsertInternal(reachable,false,i_00), i_00 != local_4c &&
          (bVar6 = SparseArray<int>::has_index(rootmap,i_00), bVar6)))) break;
      pIVar3 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      uVar8 = pIVar3[(int)i_00].out_opcode_ & 7;
      bVar6 = false;
      if ((0xbcU >> uVar8 & 1) == 0) {
        if ((3U >> uVar8 & 1) == 0) {
          i_00 = pIVar3[(int)i_00].out_opcode_ >> 4;
          bVar6 = true;
        }
        else {
          if ((pIVar3[(int)i_00].out_opcode_ & 6) != 0) {
            __assert_fail("opcode() == kInstAlt || opcode() == kInstAltMatch",
                          "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/prog.h"
                          ,0x55,"int re2::Prog::Inst::out1()");
          }
          local_44 = pIVar3[(int)i_00].field_1;
          iVar2._M_current =
               (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
          if (iVar2._M_current ==
              (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar2,&local_44.cap_)
            ;
          }
          else {
            *iVar2._M_current = (int)local_44;
            (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = iVar2._M_current + 1;
          }
          i_00 = pIVar3[(int)i_00].out_opcode_ >> 4;
          bVar6 = true;
        }
      }
    } while (bVar6);
  } while( true );
}

Assistant:

void Prog::MarkDominator(int root, SparseArray<int>* rootmap,
                         SparseArray<int>* predmap,
                         std::vector<std::vector<int>>* predvec,
                         SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition.
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        break;
    }
  }

  for (SparseSet::const_iterator i = reachable->begin();
       i != reachable->end();
       ++i) {
    int id = *i;
    if (predmap->has_index(id)) {
      for (int pred : (*predvec)[predmap->get_existing(id)]) {
        if (!reachable->contains(pred)) {
          // id has a predecessor that cannot be reached from root!
          // Therefore, id must be a "root" too - mark it as such.
          if (!rootmap->has_index(id))
            rootmap->set_new(id, rootmap->size());
        }
      }
    }
  }
}